

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Extensive
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  VmaBlockMetadata *pVVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  VmaAllocationCreateFlags VVar6;
  ulong uVar7;
  byte *pbVar8;
  size_t sVar9;
  long lVar10;
  bool otherPresent;
  bool bufferPresent;
  bool texturePresent;
  MoveAllocationData moveData;
  bool local_7b;
  bool local_7a;
  bool local_79;
  size_t local_78;
  byte *local_70;
  size_t local_68;
  MoveAllocationData local_60 [2];
  
code_r0x001bdb1e:
  if (vector->m_BufferImageGranularity == 1) {
    bVar3 = ComputeDefragmentation_Full(this,vector);
    return bVar3;
  }
  pbVar8 = (byte *)((long)this->m_AlgorithmState + index * 0x10);
  local_79 = false;
  local_7a = false;
  local_7b = false;
  bVar4 = *(byte *)((long)this->m_AlgorithmState + index * 0x10);
  switch(bVar4) {
  case 0:
  case 1:
  case 2:
    sVar9 = *(size_t *)(pbVar8 + 8);
    if (sVar9 == 0xffffffffffffffff) {
      sVar9 = (vector->m_Blocks).m_Count;
    }
    else if (sVar9 == 0) {
      *pbVar8 = 6;
      goto LAB_001bdcae;
    }
    uVar7 = sVar9 - 1;
    pVVar1 = (vector->m_Blocks).m_pArray[sVar9 - 1]->m_pMetadata;
    local_68 = (this->m_Moves).m_Count;
    local_78 = index;
    local_70 = pbVar8;
    iVar5 = (*pVVar1->_vptr_VmaBlockMetadata[0xb])(pVVar1);
    lVar10 = CONCAT44(extraout_var,iVar5);
    index = local_78;
    pbVar8 = local_70;
    sVar2 = local_68;
    while (local_78 = index, local_70 = pbVar8, local_68 = sVar2, lVar10 != 0) {
      local_60[0].move.operation = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
      local_60[0].move.dstTmpAllocation = (VmaAllocation)0x0;
      iVar5 = (*pVVar1->_vptr_VmaBlockMetadata[10])(pVVar1,lVar10);
      local_60[0].move.srcAllocation = (VmaAllocation)CONCAT44(extraout_var_00,iVar5);
      local_60[0].size = (local_60[0].move.srcAllocation)->m_Size;
      local_60[0].alignment = (local_60[0].move.srcAllocation)->m_Alignment;
      local_60[0].type = (VmaSuballocationType)(local_60[0].move.srcAllocation)->m_SuballocationType
      ;
      VVar6 = ((local_60[0].move.srcAllocation)->m_Flags & 1) * 4;
      local_60[0].flags = VVar6 + 0xc00;
      if (((local_60[0].move.srcAllocation)->m_Flags & 2) == 0) {
        local_60[0].flags = VVar6;
      }
      if (this->m_MaxPassBytes < local_60[0].size + (this->m_PassStats).bytesMoved) {
        bVar4 = this->m_IgnoredAllocs + 1;
        this->m_IgnoredAllocs = bVar4;
        if (0xf < bVar4) {
          return true;
        }
      }
      else {
        bVar3 = AllocInOtherBlock(this,0,uVar7,local_60,vector);
        if (bVar3) {
          if (local_68 == (this->m_Moves).m_Count) {
            return true;
          }
          iVar5 = (*pVVar1->_vptr_VmaBlockMetadata[0xc])(pVVar1,lVar10);
          if (CONCAT44(extraout_var_02,iVar5) != 0) {
            return true;
          }
          *(ulong *)((long)this->m_AlgorithmState + local_78 * 8) = uVar7;
          return true;
        }
      }
      iVar5 = (*pVVar1->_vptr_VmaBlockMetadata[0xc])(pVVar1,lVar10);
      index = local_78;
      pbVar8 = local_70;
      sVar2 = local_68;
      lVar10 = CONCAT44(extraout_var_01,iVar5);
    }
    if (sVar2 == (this->m_Moves).m_Count) {
      if (uVar7 < 2) goto LAB_001bdcae;
      lVar10 = sVar9 - 2;
      do {
        bVar3 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[lVar10]);
        if (bVar3) {
          return true;
        }
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      if (sVar2 != (this->m_Moves).m_Count) {
LAB_001bde57:
        bVar4 = *pbVar8;
switchD_001bdb8e_caseD_6:
        if (bVar4 == 6) {
LAB_001bde67:
          if ((vector->m_Blocks).m_Count != 0) {
            sVar9 = (this->m_Moves).m_Count;
            uVar7 = 0;
            do {
              bVar3 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[uVar7]);
              if (bVar3) {
                return true;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < (vector->m_Blocks).m_Count);
            if (sVar9 != (this->m_Moves).m_Count) {
              return false;
            }
          }
          *pbVar8 = 7;
        }
switchD_001bdb8e_caseD_7:
        return false;
      }
LAB_001bdcae:
      bVar3 = ComputeDefragmentation_Fast(this,vector);
      return bVar3;
    }
    bVar4 = 3;
    if (*pbVar8 != 0) {
      bVar4 = *pbVar8 == 2 | 4;
    }
    *pbVar8 = bVar4;
    *(ulong *)(pbVar8 + 8) = uVar7;
    goto code_r0x001bdb1e;
  case 3:
switchD_001bdb8e_caseD_3:
    local_7a = false;
    local_7b = false;
    bVar3 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_BUFFER,vector,*(size_t *)(pbVar8 + 8),&local_79,
                       &local_7a,&local_7b);
    if (!bVar3) goto LAB_001bde57;
    if (local_7a != true) {
      if (local_7b != true) goto LAB_001bde62;
      *pbVar8 = 5;
      goto switchD_001bdb8e_caseD_5;
    }
    break;
  case 4:
    bVar3 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL,vector,*(size_t *)(pbVar8 + 8),
                       &local_79,&local_7a,&local_7b);
    if (!bVar3) goto LAB_001bde57;
    if (local_79 != true) {
      if ((local_7a != false) || (local_7b == true)) {
        *pbVar8 = 3;
        goto switchD_001bdb8e_caseD_3;
      }
      goto LAB_001bde62;
    }
    *pbVar8 = 1;
    goto code_r0x001bdb1e;
  case 5:
switchD_001bdb8e_caseD_5:
    local_7b = false;
    bVar3 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_FREE,vector,*(size_t *)(pbVar8 + 8),&local_79,
                       &local_7a,&local_7b);
    if (!bVar3) goto LAB_001bde57;
    if (local_7b != true) {
LAB_001bde62:
      *pbVar8 = 6;
      goto LAB_001bde67;
    }
    break;
  default:
    goto switchD_001bdb8e_caseD_6;
  case 7:
    goto switchD_001bdb8e_caseD_7;
  }
  *pbVar8 = 0;
  goto code_r0x001bdb1e;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Extensive(VmaBlockVector& vector, size_t index)
{
    // First free single block, then populate it to the brim, then free another block, and so on

    // Fallback to previous algorithm since without granularity conflicts it can achieve max packing
    if (vector.m_BufferImageGranularity == 1)
        return ComputeDefragmentation_Full(vector);

    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateExtensive& vectorState = reinterpret_cast<StateExtensive*>(m_AlgorithmState)[index];

    bool texturePresent = false, bufferPresent = false, otherPresent = false;
    switch (vectorState.operation)
    {
    case StateExtensive::Operation::Done: // Vector defragmented
        return false;
    case StateExtensive::Operation::FindFreeBlockBuffer:
    case StateExtensive::Operation::FindFreeBlockTexture:
    case StateExtensive::Operation::FindFreeBlockAll:
    {
        // No more blocks to free, just perform fast realloc and move to cleanup
        if (vectorState.firstFreeBlock == 0)
        {
            vectorState.operation = StateExtensive::Operation::Cleanup;
            return ComputeDefragmentation_Fast(vector);
        }

        // No free blocks, have to clear last one
        size_t last = (vectorState.firstFreeBlock == SIZE_MAX ? vector.GetBlockCount() : vectorState.firstFreeBlock) - 1;
        VmaBlockMetadata* freeMetadata = vector.GetBlock(last)->m_pMetadata;

        const size_t prevMoveCount = m_Moves.size();
        for (VmaAllocHandle handle = freeMetadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = freeMetadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, freeMetadata);
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            if (AllocInOtherBlock(0, last, moveData, vector))
            {
                // Full clear performed already
                if (prevMoveCount != m_Moves.size() && freeMetadata->GetNextAllocation(handle) == VK_NULL_HANDLE)
                    reinterpret_cast<size_t*>(m_AlgorithmState)[index] = last;
                return true;
            }
        }

        if (prevMoveCount == m_Moves.size())
        {
            // Cannot perform full clear, have to move data in other blocks around
            if (last != 0)
            {
                for (size_t i = last - 1; i; --i)
                {
                    if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                        return true;
                }
            }

            if (prevMoveCount == m_Moves.size())
            {
                // No possible reallocs within blocks, try to move them around fast
                return ComputeDefragmentation_Fast(vector);
            }
        }
        else
        {
            switch (vectorState.operation)
            {
            case StateExtensive::Operation::FindFreeBlockBuffer:
                vectorState.operation = StateExtensive::Operation::MoveBuffers;
                break;
            default:
                VMA_ASSERT(0);
            case StateExtensive::Operation::FindFreeBlockTexture:
                vectorState.operation = StateExtensive::Operation::MoveTextures;
                break;
            case StateExtensive::Operation::FindFreeBlockAll:
                vectorState.operation = StateExtensive::Operation::MoveAll;
                break;
            }
            vectorState.firstFreeBlock = last;
            // Nothing done, block found without reallocations, can perform another reallocs in same pass
            return ComputeDefragmentation_Extensive(vector, index);
        }
        break;
    }
    case StateExtensive::Operation::MoveTextures:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (texturePresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockTexture;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!bufferPresent && !otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more textures to move, check buffers
            vectorState.operation = StateExtensive::Operation::MoveBuffers;
            bufferPresent = false;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveBuffers:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_BUFFER, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (bufferPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more buffers to move, check all others
            vectorState.operation = StateExtensive::Operation::MoveAll;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveAll:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_FREE, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }
            // Everything moved
            vectorState.operation = StateExtensive::Operation::Cleanup;
        }
        break;
    }
    case StateExtensive::Operation::Cleanup:
        // Cleanup is handled below so that other operations may reuse the cleanup code. This case is here to prevent the unhandled enum value warning (C4062).
        break;
    }

    if (vectorState.operation == StateExtensive::Operation::Cleanup)
    {
        // All other work done, pack data in blocks even tighter if possible
        const size_t prevMoveCount = m_Moves.size();
        for (size_t i = 0; i < vector.GetBlockCount(); ++i)
        {
            if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                return true;
        }

        if (prevMoveCount == m_Moves.size())
            vectorState.operation = StateExtensive::Operation::Done;
    }
    return false;
}